

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  undefined4 uVar1;
  istream *this;
  ostream *poVar2;
  int iVar3;
  undefined4 uVar4;
  size_type *local_78;
  string enemy;
  string answer;
  int dist;
  int count;
  
  do {
    std::istream::operator>>((istream *)&std::cin,(int *)(answer.field_2._M_local_buf + 0xc));
    std::istream::ignore();
    answer._M_dataplus._M_p = (pointer)0x0;
    answer._M_string_length._0_1_ = 0;
    enemy.field_2._8_8_ = &answer._M_string_length;
    if (0 < (int)answer.field_2._12_4_) {
      uVar4 = 0x18894;
      iVar3 = 0;
      do {
        enemy._M_dataplus._M_p = (pointer)0x0;
        enemy._M_string_length._0_1_ = 0;
        local_78 = &enemy._M_string_length;
        this = std::operator>>((istream *)&std::cin,(string *)&local_78);
        std::istream::operator>>(this,(int *)(answer.field_2._M_local_buf + 8));
        std::istream::ignore();
        uVar1 = answer.field_2._8_4_;
        if ((int)answer.field_2._8_4_ < (int)uVar4) {
          std::__cxx11::string::_M_assign((string *)(enemy.field_2._M_local_buf + 8));
          uVar4 = uVar1;
        }
        if (local_78 != &enemy._M_string_length) {
          operator_delete(local_78,CONCAT71(enemy._M_string_length._1_7_,
                                            (undefined1)enemy._M_string_length) + 1);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < (int)answer.field_2._12_4_);
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)enemy.field_2._8_8_,
                        (long)answer._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((size_type *)enemy.field_2._8_8_ != &answer._M_string_length) {
      operator_delete((void *)enemy.field_2._8_8_,
                      CONCAT71(answer._M_string_length._1_7_,(undefined1)answer._M_string_length) +
                      1);
    }
  } while( true );
}

Assistant:

int main()
{

    // game loop
    while (1) {
        int count; // The number of current enemy ships within range
        cin >> count; cin.ignore();
        std::string answer;
        int min = 100500;
        for (int i = 0; i < count; i++)
        {
            string enemy; // The name of this enemy
            int dist; // The distance to your cannon of this enemy
            cin >> enemy >> dist; cin.ignore();
            if (min > dist)
            {
                min = dist;
                answer = enemy;
            }
        }

        // Write an action using cout. DON'T FORGET THE "<< endl"
        // To debug: cerr << "Debug messages..." << endl;

        cout << answer << endl; // The name of the most threatening enemy (HotDroid is just one example)
    }
}